

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache_test.cc
# Opt level: O3

void TemplateCacheUnittest::TestGetTemplate(void)

{
  char *pcVar1;
  pointer pcVar2;
  Template *tpl;
  Template *pTVar3;
  Template *tpl_00;
  long lVar4;
  _Alloc_hider __s;
  TemplateCache cache2;
  string filename;
  TemplateCache cache1;
  TemplateDictionary empty_dict;
  undefined1 local_150 [64];
  undefined1 local_110 [32];
  string local_f0;
  TemplateString local_d0 [2];
  TemplateDictionary local_90 [112];
  
  ctemplate::TemplateCache::TemplateCache((TemplateCache *)local_d0);
  local_150._0_8_ = "dict";
  local_150._8_8_ = 4;
  local_150[0x10] = true;
  local_150._24_8_ = 0;
  ctemplate::TemplateDictionary::TemplateDictionary
            (local_90,(TemplateString *)local_150,(UnsafeArena *)0x0);
  pcVar1 = local_150 + 0x10;
  local_150._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_150,"{This is perfectly valid} yay!","");
  ctemplate::StringToTemplateFile(&local_f0,(string *)local_150);
  if ((char *)local_150._0_8_ != pcVar1) {
    operator_delete((void *)local_150._0_8_);
  }
  local_150._0_8_ = local_f0._M_dataplus._M_p;
  local_150._8_8_ = local_f0._M_string_length;
  local_150[0x10] = false;
  local_150._24_8_ = 0;
  tpl = (Template *)ctemplate::TemplateCache::GetTemplate(local_d0,(Strip)local_150);
  __s._M_p = "";
  if (local_f0._M_dataplus._M_p != (char *)0x0) {
    __s._M_p = local_f0._M_dataplus._M_p;
  }
  local_150._0_8_ = __s._M_p;
  local_150._8_8_ = strlen(__s._M_p);
  local_150[0x10] = __s._M_p < &data_start && &UNK_0010669f < __s._M_p;
  local_150._24_8_ = 0;
  pTVar3 = (Template *)ctemplate::TemplateCache::GetTemplate(local_d0,(Strip)local_150);
  local_150._0_8_ = local_f0._M_dataplus._M_p;
  local_150._8_8_ = local_f0._M_string_length;
  local_150[0x10] = false;
  local_150._24_8_ = 0;
  tpl_00 = (Template *)ctemplate::TemplateCache::GetTemplate(local_d0,(Strip)local_150);
  if (((tpl == (Template *)0x0) || (pTVar3 == (Template *)0x0)) || (tpl_00 == (Template *)0x0)) {
    printf("ASSERT FAILED, line %d: %s\n",0x60,"tpl1 && tpl2 && tpl3");
    __assert_fail("tpl1 && tpl2 && tpl3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                  ,0x60,"static void TemplateCacheUnittest::TestGetTemplate()");
  }
  if (tpl != pTVar3) {
    printf("ASSERT FAILED, line %d: %s\n",0x61,"tpl1 == tpl2");
    __assert_fail("tpl1 == tpl2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                  ,0x61,"static void TemplateCacheUnittest::TestGetTemplate()");
  }
  if (tpl != tpl_00) {
    local_150._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_150,"{This is perfectly valid} yay!","");
    ctemplate::AssertExpandIs(tpl,local_90,(string *)local_150,true);
    if ((char *)local_150._0_8_ != pcVar1) {
      operator_delete((void *)local_150._0_8_);
    }
    local_150._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_150,"{This is perfectly valid} yay!","");
    ctemplate::AssertExpandIs(pTVar3,local_90,(string *)local_150,true);
    if ((char *)local_150._0_8_ != pcVar1) {
      operator_delete((void *)local_150._0_8_);
    }
    local_150._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_150,"{This is perfectly valid} yay!","");
    ctemplate::AssertExpandIs(tpl_00,local_90,(string *)local_150,true);
    if ((char *)local_150._0_8_ != pcVar1) {
      operator_delete((void *)local_150._0_8_);
    }
    local_150._0_8_ = "/yakakak";
    local_150._8_8_ = 8;
    local_150[0x10] = true;
    local_150._24_8_ = 0;
    lVar4 = ctemplate::TemplateCache::GetTemplate(local_d0,(Strip)local_150);
    if (lVar4 != 0) {
      printf("ASSERT FAILED, line %d: %s\n",0x69,"!tpl4");
      __assert_fail("!tpl4",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                    ,0x69,"static void TemplateCacheUnittest::TestGetTemplate()");
    }
    ctemplate::TemplateCache::TemplateCache((TemplateCache *)local_150);
    local_110._0_8_ = local_f0._M_dataplus._M_p;
    local_110._8_8_ = local_f0._M_string_length;
    local_110[0x10] = '\0';
    local_110._24_8_ = 0;
    pTVar3 = (Template *)
             ctemplate::TemplateCache::GetTemplate((TemplateString *)local_150,(Strip)local_110);
    if (pTVar3 == (Template *)0x0) {
      printf("ASSERT FAILED, line %d: %s\n",0x6e,"tpl5");
      __assert_fail("tpl5",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                    ,0x6e,"static void TemplateCacheUnittest::TestGetTemplate()");
    }
    if (pTVar3 != tpl) {
      pcVar2 = local_110 + 0x10;
      local_110._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_110,"{This is perfectly valid} yay!","");
      ctemplate::AssertExpandIs(pTVar3,local_90,(string *)local_110,true);
      if ((pointer)local_110._0_8_ != pcVar2) {
        operator_delete((void *)local_110._0_8_);
      }
      local_110._0_8_ = local_f0._M_dataplus._M_p;
      local_110._8_8_ = local_f0._M_string_length;
      local_110[0x10] = '\0';
      local_110._24_8_ = 0;
      pTVar3 = (Template *)
               ctemplate::Template::GetTemplate((TemplateString *)local_110,DO_NOT_STRIP);
      if (pTVar3 != (Template *)0x0) {
        if (pTVar3 != tpl) {
          local_110._0_8_ = pcVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_110,"{This is perfectly valid} yay!","");
          ctemplate::AssertExpandIs(pTVar3,local_90,(string *)local_110,true);
          if ((pointer)local_110._0_8_ != pcVar2) {
            operator_delete((void *)local_110._0_8_);
          }
          ctemplate::TemplateCache::~TemplateCache((TemplateCache *)local_150);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p);
          }
          ctemplate::TemplateDictionary::~TemplateDictionary(local_90);
          ctemplate::TemplateCache::~TemplateCache((TemplateCache *)local_d0);
          return;
        }
        printf("ASSERT FAILED, line %d: %s\n",0x75,"tpl6 != tpl1");
        __assert_fail("tpl6 != tpl1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                      ,0x75,"static void TemplateCacheUnittest::TestGetTemplate()");
      }
      printf("ASSERT FAILED, line %d: %s\n",0x74,"tpl6");
      __assert_fail("tpl6",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                    ,0x74,"static void TemplateCacheUnittest::TestGetTemplate()");
    }
    printf("ASSERT FAILED, line %d: %s\n",0x6f,"tpl5 != tpl1");
    __assert_fail("tpl5 != tpl1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                  ,0x6f,"static void TemplateCacheUnittest::TestGetTemplate()");
  }
  printf("ASSERT FAILED, line %d: %s\n",0x62,"tpl1 != tpl3");
  __assert_fail("tpl1 != tpl3",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                ,0x62,"static void TemplateCacheUnittest::TestGetTemplate()");
}

Assistant:

static void TestGetTemplate() {
    // Tests the cache
    TemplateCache cache1;
    const char* text = "{This is perfectly valid} yay!";
    TemplateDictionary empty_dict("dict");

    string filename = StringToTemplateFile(text);
    const Template* tpl1 = cache1.GetTemplate(filename, DO_NOT_STRIP);
    const Template* tpl2 = cache1.GetTemplate(filename.c_str(), DO_NOT_STRIP);
    const Template* tpl3 = cache1.GetTemplate(filename, STRIP_WHITESPACE);
    ASSERT(tpl1 && tpl2 && tpl3);
    ASSERT(tpl1 == tpl2);
    ASSERT(tpl1 != tpl3);
    AssertExpandIs(tpl1, &empty_dict, text, true);
    AssertExpandIs(tpl2, &empty_dict, text, true);
    AssertExpandIs(tpl3, &empty_dict, text, true);

    // Tests that a nonexistent template returns NULL
    const Template* tpl4 = cache1.GetTemplate("/yakakak", STRIP_WHITESPACE);
    ASSERT(!tpl4);

    // Make sure we get different results if we use a different cache.
    TemplateCache cache2;
    const Template* tpl5 = cache2.GetTemplate(filename, DO_NOT_STRIP);
    ASSERT(tpl5);
    ASSERT(tpl5 != tpl1);
    AssertExpandIs(tpl5, &empty_dict, text, true);

    // And different results yet if we use the default cache.
    const Template* tpl6 = Template::GetTemplate(filename, DO_NOT_STRIP);
    ASSERT(tpl6);
    ASSERT(tpl6 != tpl1);
    AssertExpandIs(tpl6, &empty_dict, text, true);
  }